

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaParticlePtr
xmlSchemaParseAny(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  int iVar1;
  int minOccurs;
  int iVar2;
  xmlSchemaWildcardPtr wildc;
  xmlSchemaAnnotPtr local_58;
  xmlSchemaAnnotPtr annot;
  xmlAttrPtr attr;
  int max;
  int min;
  xmlSchemaWildcardPtr wild;
  xmlNodePtr child;
  xmlSchemaParticlePtr particle;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  local_58 = (xmlSchemaAnnotPtr)0x0;
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    for (annot = (xmlSchemaAnnotPtr)node->properties; annot != (xmlSchemaAnnotPtr)0x0;
        annot = annot[3].next) {
      if (annot[4].content == (xmlNodePtr)0x0) {
        iVar1 = xmlStrEqual((xmlChar *)annot[1].next,"id");
        if (((iVar1 == 0) &&
            (iVar1 = xmlStrEqual((xmlChar *)annot[1].next,(xmlChar *)"minOccurs"), iVar1 == 0)) &&
           ((iVar1 = xmlStrEqual((xmlChar *)annot[1].next,(xmlChar *)"maxOccurs"), iVar1 == 0 &&
            ((iVar1 = xmlStrEqual((xmlChar *)annot[1].next,"namespace"), iVar1 == 0 &&
             (iVar1 = xmlStrEqual((xmlChar *)annot[1].next,(xmlChar *)"processContents"), iVar1 == 0
             )))))) {
          xmlSchemaPIllegalAttrErr
                    (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,
                     (xmlAttrPtr)annot);
        }
      }
      else {
        iVar1 = xmlStrEqual((annot[4].content)->name,xmlSchemaNs);
        if (iVar1 != 0) {
          xmlSchemaPIllegalAttrErr
                    (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,
                     (xmlAttrPtr)annot);
        }
      }
    }
    xmlSchemaPValAttrID(ctxt,node,"id");
    iVar1 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,1,"(xs:nonNegativeInteger | unbounded)");
    minOccurs = xmlGetMinOccurs(ctxt,node,0,-1,1,"xs:nonNegativeInteger");
    xmlSchemaPCheckParticleCorrect_2(ctxt,(xmlSchemaParticlePtr)0x0,node,minOccurs,iVar1);
    wildc = xmlSchemaAddWildcard(ctxt,schema,XML_SCHEMA_TYPE_ANY,node);
    if (wildc == (xmlSchemaWildcardPtr)0x0) {
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      xmlSchemaParseWildcardNs(ctxt,schema,wildc,node);
      wild = (xmlSchemaWildcardPtr)node->children;
      if (((((xmlNodePtr)wild != (xmlNodePtr)0x0) && (((xmlNodePtr)wild)->ns != (xmlNs *)0x0)) &&
          (iVar2 = xmlStrEqual(((xmlNodePtr)wild)->name,(xmlChar *)"annotation"), iVar2 != 0)) &&
         (iVar2 = xmlStrEqual(((xmlNodePtr)wild)->ns->href,xmlSchemaNs), iVar2 != 0)) {
        local_58 = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)wild,1);
        wild = (xmlSchemaWildcardPtr)((xmlNodePtr)wild)->next;
      }
      if (wild != (xmlSchemaWildcardPtr)0x0) {
        xmlSchemaPContentErr
                  (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,node,
                   (xmlNodePtr)wild,(char *)0x0,"(annotation?)");
      }
      if ((minOccurs == 0) && (iVar1 == 0)) {
        ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
      else {
        ctxt_local = (xmlSchemaParserCtxtPtr)xmlSchemaAddParticle(ctxt,node,minOccurs,iVar1);
        if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
          ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
        }
        else {
          ctxt_local->errCtxt = local_58;
          ctxt_local->warning = (xmlSchemaValidityWarningFunc)wildc;
        }
      }
    }
  }
  return (xmlSchemaParticlePtr)ctxt_local;
}

Assistant:

static xmlSchemaParticlePtr
xmlSchemaParseAny(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                  xmlNodePtr node)
{
    xmlSchemaParticlePtr particle;
    xmlNodePtr child = NULL;
    xmlSchemaWildcardPtr wild;
    int min, max;
    xmlAttrPtr attr;
    xmlSchemaAnnotPtr annot = NULL;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
	        (!xmlStrEqual(attr->name, BAD_CAST "namespace")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "processContents"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * minOccurs/maxOccurs.
    */
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
	"(xs:nonNegativeInteger | unbounded)");
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1,
	"xs:nonNegativeInteger");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    /*
    * Create & parse the wildcard.
    */
    wild = xmlSchemaAddWildcard(ctxt, schema, XML_SCHEMA_TYPE_ANY, node);
    if (wild == NULL)
	return (NULL);
    xmlSchemaParseWildcardNs(ctxt, schema, wild, node);
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?)");
    }
    /*
    * No component if minOccurs==maxOccurs==0.
    */
    if ((min == 0) && (max == 0)) {
	/* Don't free the wildcard, since it's already on the list. */
	return (NULL);
    }
    /*
    * Create the particle.
    */
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
        return (NULL);
    particle->annot = annot;
    particle->children = (xmlSchemaTreeItemPtr) wild;

    return (particle);
}